

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void __thiscall diy::MemoryBuffer::wipe(MemoryBuffer *this)

{
  _Vector_base<char,_std::allocator<char>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start =
       (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_28._M_impl.super__Vector_impl_data._M_finish =
       (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_28);
  this->position = 0;
  return;
}

Assistant:

void                wipe()                                      { std::vector<char>().swap(buffer); reset(); }